

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWave_Play(FACTWave *pWave)

{
  code *pcVar1;
  int iVar2;
  long in_RDI;
  SDL_AssertState sdl_assert_state;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint32_t uVar3;
  
  if (in_RDI == 0) {
    uVar3 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x116025);
    do {
      if ((*(uint *)(in_RDI + 0x20) & 0x18) == 0) goto LAB_0011607a;
      iVar2 = SDL_ReportAssertion(&FACTWave_Play::sdl_assert_data,"FACTWave_Play",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FACT.c"
                                  ,0x855);
    } while (iVar2 == 0);
    if (iVar2 == 1) {
      pcVar1 = (code *)swi(3);
      uVar3 = (*pcVar1)();
      return uVar3;
    }
LAB_0011607a:
    *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) | 8;
    *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) & 0xffffff9f;
    FAudioSourceVoice_Start
              ((FAudioSourceVoice *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
    FAudio_PlatformUnlockMutex((FAudioMutex)0x1160c1);
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

uint32_t FACTWave_Play(FACTWave *pWave)
{
	if (pWave == NULL)
	{
		return 1;
	}
	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);
	FAudio_assert(!(pWave->state & (FACT_STATE_PLAYING | FACT_STATE_STOPPING)));
	pWave->state |= FACT_STATE_PLAYING;
	pWave->state &= ~(
		FACT_STATE_PAUSED |
		FACT_STATE_STOPPED
	);
	FAudioSourceVoice_Start(pWave->voice, 0, 0);
	FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
	return 0;
}